

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall
llvm::cl::HideUnrelatedOptions
          (cl *this,ArrayRef<const_llvm::cl::OptionCategory_*> Categories,SubCommand *Sub)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *this_00;
  StringMapEntry<llvm::cl::Option_*> *pSVar2;
  OptionCategory **ppOVar3;
  StringMapEntry<llvm::cl::Option_*> *I;
  iterator __end1;
  iterator __begin1;
  StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *__range1;
  iterator CategoriesEnd;
  iterator CategoriesBegin;
  SubCommand *Sub_local;
  ArrayRef<const_llvm::cl::OptionCategory_*> Categories_local;
  
  Categories_local.Data = Categories.Data;
  Sub_local = (SubCommand *)this;
  __first = ArrayRef<const_llvm::cl::OptionCategory_*>::begin
                      ((ArrayRef<const_llvm::cl::OptionCategory_*> *)&Sub_local);
  __last = ArrayRef<const_llvm::cl::OptionCategory_*>::end
                     ((ArrayRef<const_llvm::cl::OptionCategory_*> *)&Sub_local);
  this_00 = (StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *)(Categories.Length + 0x80);
  __end1 = StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::begin(this_00);
  I = (StringMapEntry<llvm::cl::Option_*> *)
      StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::end(this_00);
  while( true ) {
    bVar1 = iterator_facade_base<llvm::StringMapIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_llvm::StringMapEntry<llvm::cl::Option_*>_*,_llvm::StringMapEntry<llvm::cl::Option_*>_&>
            ::operator!=((iterator_facade_base<llvm::StringMapIterator<llvm::cl::Option_*>,_std::forward_iterator_tag,_llvm::StringMapEntry<llvm::cl::Option_*>,_long,_llvm::StringMapEntry<llvm::cl::Option_*>_*,_llvm::StringMapEntry<llvm::cl::Option_*>_&>
                          *)&__end1,(StringMapIterator<llvm::cl::Option_*> *)&I);
    if (!bVar1) break;
    pSVar2 = StringMapIterator<llvm::cl::Option_*>::operator*(&__end1);
    ppOVar3 = std::find<llvm::cl::OptionCategory_const*const*,llvm::cl::OptionCategory*>
                        (__first,__last,&pSVar2->second->Category);
    if ((ppOVar3 == __last) && (pSVar2->second->Category != &GenericCategory)) {
      Option::setHiddenFlag(pSVar2->second,ReallyHidden);
    }
    StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
    ::operator++(&__end1.
                  super_StringMapIterBase<llvm::StringMapIterator<llvm::cl::Option_*>,_llvm::StringMapEntry<llvm::cl::Option_*>_>
                );
  }
  return;
}

Assistant:

void cl::HideUnrelatedOptions(ArrayRef<const cl::OptionCategory *> Categories,
                              SubCommand &Sub) {
  auto CategoriesBegin = Categories.begin();
  auto CategoriesEnd = Categories.end();
  for (auto &I : Sub.OptionsMap) {
    if (std::find(CategoriesBegin, CategoriesEnd, I.second->Category) ==
            CategoriesEnd &&
        I.second->Category != &GenericCategory)
      I.second->setHiddenFlag(cl::ReallyHidden);
  }
}